

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall slang::ast::Compilation::noteCannotCache(Compilation *this,Scope *scope)

{
  Symbol *instanceBody;
  bool bVar1;
  InstanceSideEffects *pIVar2;
  
  do {
    instanceBody = scope->thisSym;
    if (instanceBody->kind == InstanceBody) {
      pIVar2 = getOrAddSideEffects(this,instanceBody);
      bVar1 = true;
      if (pIVar2->cannotCache == false) {
        pIVar2->cannotCache = true;
        goto LAB_002e8599;
      }
    }
    else {
LAB_002e8599:
      scope = Symbol::getHierarchicalParent(instanceBody);
      bVar1 = false;
    }
    if ((scope == (Scope *)0x0) || (bVar1)) {
      return;
    }
  } while( true );
}

Assistant:

void Compilation::noteCannotCache(const Scope& scope) {
    auto currScope = &scope;
    do {
        auto& symbol = currScope->asSymbol();
        if (symbol.kind == SymbolKind::InstanceBody) {
            auto& entry = getOrAddSideEffects(symbol);
            if (entry.cannotCache)
                break;

            entry.cannotCache = true;
        }

        currScope = symbol.getHierarchicalParent();
    } while (currScope);
}